

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *p)

{
  bmcg_sat_solver *s;
  int iVar1;
  Vec_Int_t *p_00;
  int *plits;
  int local_28;
  int nFanins;
  int k;
  int i;
  Vec_Int_t *vLits;
  Zyx_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  nFanins = p->pPars->nVars;
  while( true ) {
    if (p->nObjs <= nFanins) {
      s = p->pSat;
      plits = Vec_IntArray(p_00);
      iVar1 = Vec_IntSize(p_00);
      iVar1 = bmcg_sat_solver_addclause(s,plits,iVar1);
      if (iVar1 != 0) {
        Vec_IntFree(p_00);
      }
      p_local._4_4_ = (uint)(iVar1 != 0);
      return p_local._4_4_;
    }
    iVar1 = Zyx_ManCollectFanins(p,nFanins);
    if (iVar1 != p->pPars->nLutSize) break;
    for (local_28 = 0; local_28 < p->pPars->nLutSize; local_28 = local_28 + 1) {
      iVar1 = Zyx_TopoVar(p,nFanins,p->pFanins[nFanins][local_28]);
      iVar1 = Abc_Var2Lit(iVar1,1);
      Vec_IntPush(p_00,iVar1);
    }
    nFanins = nFanins + 1;
  }
  __assert_fail("nFanins == p->pPars->nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                ,0x3e0,"int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *)");
}

Assistant:

int Zyx_ManAddCnfBlockSolution( Zyx_Man_t * p )
{
    Vec_Int_t * vLits = Vec_IntAlloc( 100 ); int i, k;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        assert( nFanins == p->pPars->nLutSize );
        for ( k = 0; k < p->pPars->nLutSize; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(Zyx_TopoVar(p, i, p->pFanins[i][k]), 1) );
    }
    //Zyx_ManPrintVarMap( p, 1 );
    //Zyx_PrintClause( Vec_IntArray(vLits), Vec_IntSize(vLits) );
    if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) ) )
        return 0;
    Vec_IntFree( vLits );
    return 1;
}